

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
get_param::operator()
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          get_param *this,int arg_position,string_view longp,string_view shortp)

{
  int iVar1;
  size_t __n;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar5 = longp._M_len;
  pcVar6 = this->argv[arg_position];
  __n = strlen(pcVar6);
  this->i = arg_position;
  local_40._M_len = __n;
  local_40._M_str = pcVar6;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (&local_40,longp._M_str,0,uVar5);
  if (((uVar5 < __n) && (sVar2 == 0)) && ((pcVar6[uVar5] == '=' || (pcVar6[uVar5] == ':')))) {
    uVar5 = uVar5 + 1;
    sVar7 = __n - uVar5;
    if (__n < uVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar5,__n);
    }
    pcVar6 = pcVar6 + uVar5;
  }
  else {
    local_40._M_len = __n;
    local_40._M_str = pcVar6;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_40,shortp._M_str,0,shortp._M_len);
    sVar7 = __n - shortp._M_len;
    if ((__n < shortp._M_len || sVar7 == 0) || (sVar2 != 0)) {
      iVar4 = arg_position + 1;
      if (this->argc <= iVar4) {
LAB_0011e3be:
        bVar3 = false;
        goto LAB_0011e3ee;
      }
      if (__n == uVar5) {
        if (__n != 0) {
          iVar1 = bcmp(pcVar6,longp._M_str,__n);
          if (iVar1 != 0) goto LAB_0011e39e;
        }
      }
      else {
LAB_0011e39e:
        if (__n != shortp._M_len) goto LAB_0011e3be;
        if (__n != 0) {
          iVar1 = bcmp(pcVar6,shortp._M_str,__n);
          if (iVar1 != 0) goto LAB_0011e3be;
        }
      }
      this->i = iVar4;
      pcVar6 = this->argv[iVar4];
      sVar7 = strlen(pcVar6);
    }
    else {
      pcVar6 = pcVar6 + shortp._M_len;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = sVar7;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = pcVar6;
  bVar3 = true;
LAB_0011e3ee:
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

constexpr std::optional<std::string_view> operator()(
      int arg_position,
      const std::string_view longp,
      const std::string_view shortp) noexcept
    {
        std::string_view arg(argv[arg_position]);
        i = arg_position;

        if (starts_with(arg, longp) && arg.size() > longp.size() &&
            (arg[longp.size()] == '=' || arg[longp.size()] == ':'))
            return arg.substr(longp.size() + 1);

        if (starts_with(arg, shortp) && arg.size() > shortp.size())
            return arg.substr(shortp.size());

        if (arg_position + 1 < argc) {
            if (arg == longp) {
                i = arg_position + 1;
                return argv[i];
            }

            if (arg == shortp) {
                i = arg_position + 1;
                return argv[i];
            }
        }

        return std::nullopt;
    }